

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void __thiscall
ghc::filesystem::recursive_directory_iterator::pop
          (recursive_directory_iterator *this,error_code *ec)

{
  int iVar1;
  element_type *peVar2;
  reference pvVar3;
  bool local_49;
  directory_iterator local_38;
  recursive_directory_iterator local_28;
  error_code *local_18;
  error_code *ec_local;
  recursive_directory_iterator *this_local;
  
  local_18 = ec;
  ec_local = (error_code *)this;
  iVar1 = depth(this);
  if (iVar1 == 0) {
    recursive_directory_iterator(&local_28);
    operator=(this,&local_28);
    ~recursive_directory_iterator(&local_28);
  }
  else {
    do {
      peVar2 = std::
               __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      std::
      stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
      ::pop(&peVar2->_dir_iter_stack);
      peVar2 = std::
               __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      pvVar3 = std::
               stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
               ::top(&peVar2->_dir_iter_stack);
      directory_iterator::increment(pvVar3,local_18);
      iVar1 = depth(this);
      local_49 = false;
      if (iVar1 != 0) {
        peVar2 = std::
                 __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pvVar3 = std::
                 stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                 ::top(&peVar2->_dir_iter_stack);
        directory_iterator::directory_iterator(&local_38);
        local_49 = directory_iterator::operator==(pvVar3,&local_38);
        directory_iterator::~directory_iterator(&local_38);
      }
    } while (local_49 != false);
  }
  return;
}

Assistant:

GHC_INLINE void recursive_directory_iterator::pop(std::error_code& ec)
{
    if (depth() == 0) {
        *this = recursive_directory_iterator();
    }
    else {
        do {
            _impl->_dir_iter_stack.pop();
            _impl->_dir_iter_stack.top().increment(ec);
        } while (depth() && _impl->_dir_iter_stack.top() == directory_iterator());
    }
}